

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O1

bool tinyusdz::ReadUSDZAssetInfoFromMemory
               (uint8_t *addr,size_t length,bool asset_on_memory,USDZAsset *asset,string *warn,
               string *err)

{
  ulong uVar1;
  ulong uVar2;
  pointer puVar3;
  bool bVar4;
  mapped_type *pmVar5;
  long lVar6;
  ulong uVar7;
  vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  assetInfos;
  vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  local_48;
  
  if (asset == (USDZAsset *)0x0) {
    bVar4 = false;
  }
  else {
    local_48.
    super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar4 = anon_unknown_27::ParseUSDZHeader(addr,length,&local_48,err,warn);
    if (bVar4) {
      if (local_48.
          super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_48.
          super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar6 = 0;
        uVar7 = 0;
        do {
          uVar1 = *(ulong *)((long)&(local_48.
                                     super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->byte_begin + lVar6)
          ;
          if ((length < uVar1) ||
             (uVar2 = *(ulong *)((long)&(local_48.
                                         super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->byte_end +
                                lVar6), length < uVar2)) {
            if (err != (string *)0x0) {
              ::std::__cxx11::string::append((char *)err);
            }
            goto LAB_0012a78d;
          }
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                                 *)asset,(key_type *)
                                         ((long)&((local_48.
                                                  super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 filename)._M_dataplus._M_p + lVar6));
          pmVar5->first = uVar1;
          pmVar5->second = uVar2;
          uVar7 = uVar7 + 1;
          lVar6 = lVar6 + 0x30;
        } while (uVar7 < (ulong)(((long)local_48.
                                        super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_48.
                                        super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                -0x5555555555555555));
      }
      if (asset_on_memory) {
        puVar3 = (asset->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((asset->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish != puVar3) {
          (asset->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar3;
        }
        asset->addr = addr;
        asset->size = length;
      }
      else {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&asset->data,length);
        memcpy((asset->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,addr,length);
        asset->addr = (uint8_t *)0x0;
        asset->size = 0;
      }
      bVar4 = true;
    }
    else {
LAB_0012a78d:
      bVar4 = false;
    }
    std::
    vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
    ::~vector(&local_48);
  }
  return bVar4;
}

Assistant:

bool ReadUSDZAssetInfoFromMemory(const uint8_t *addr, const size_t length, const bool asset_on_memory, USDZAsset *asset,
  std::string *warn, std::string *err) {

  if (!asset) {
    return false;
  }

  std::vector<USDZAssetInfo> assetInfos;
  if (!ParseUSDZHeader(addr, length, &assetInfos, warn, err)) {
    return false;
  }

  for (size_t i = 0; i < assetInfos.size(); i++) {
    if (assetInfos[i].byte_begin > length) {
      if (err) {
        (*err) += "Invalid byte begin offset in USDZ asset header.";
      }
      return false;
    }
    if (assetInfos[i].byte_end > length) {
      if (err) {
        (*err) += "Invalid byte end offset in USDZ asset header.";
      }
      return false;
    }
    // Assume same filename does not exist.
    asset->asset_map[assetInfos[i].filename] = std::make_pair(assetInfos[i].byte_begin, assetInfos[i].byte_end);
  }

  if (asset_on_memory) {
    asset->data.clear();
    asset->addr = addr;
    asset->size = length;
  } else {
    // copy content
    asset->data.resize(length);
    memcpy(asset->data.data(), addr, length);
    asset->addr = nullptr;
    asset->size = 0;
  }

  return true;
}